

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ikfast.h
# Opt level: O1

void __thiscall
ikfast::IkSolution<double>::GetSolutionIndices
          (IkSolution<double> *this,vector<unsigned_int,_std::allocator<unsigned_int>_> *v)

{
  int *piVar1;
  byte bVar2;
  iterator iVar3;
  pointer pIVar4;
  long lVar5;
  bool bVar6;
  long lVar7;
  uint uVar8;
  ulong uVar9;
  IkSolution<double> *pIVar10;
  long lVar11;
  uint local_58 [2];
  IkSolution<double> *local_50;
  long local_48;
  ulong local_40;
  ulong local_38;
  
  local_50 = this;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize(v,0);
  local_58[1] = 0;
  iVar3._M_current = *(uint **)(v + 8);
  if (iVar3._M_current == *(uint **)(v + 0x10)) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
              (v,iVar3,local_58 + 1);
  }
  else {
    *iVar3._M_current = 0;
    *(uint **)(v + 8) = iVar3._M_current + 1;
  }
  uVar8 = (int)((long)(local_50->_vbasesol).
                      super__Vector_base<ikfast::IkSingleDOFSolutionBase<double>,_std::allocator<ikfast::IkSingleDOFSolutionBase<double>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)(local_50->_vbasesol).
                      super__Vector_base<ikfast::IkSingleDOFSolutionBase<double>,_std::allocator<ikfast::IkSingleDOFSolutionBase<double>_>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x55555555;
  if (0 < (int)uVar8) {
    local_40 = (ulong)(uVar8 & 0x7fffffff);
    pIVar10 = local_50;
    do {
      uVar9 = local_40 - 1;
      pIVar4 = (pIVar10->_vbasesol).
               super__Vector_base<ikfast::IkSingleDOFSolutionBase<double>,_std::allocator<ikfast::IkSingleDOFSolutionBase<double>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      bVar2 = pIVar4[uVar9].maxsolutions;
      local_38 = uVar9;
      if ((1 < bVar2) && (bVar2 != 0xff)) {
        lVar5 = *(long *)v;
        local_48 = *(long *)(v + 8);
        lVar11 = local_48 - lVar5 >> 2;
        if (local_48 != lVar5) {
          lVar7 = 0;
          do {
            *(uint *)(lVar5 + lVar7 * 4) = *(int *)(lVar5 + lVar7 * 4) * (uint)bVar2;
            lVar7 = lVar7 + 1;
          } while (lVar11 + (ulong)(lVar11 == 0) != lVar7);
        }
        if (local_48 != lVar5 && pIVar4[uVar9].indices[1] != 0xff) {
          lVar7 = 0;
          do {
            local_58[0] = (uint)(pIVar10->_vbasesol).
                                super__Vector_base<ikfast::IkSingleDOFSolutionBase<double>,_std::allocator<ikfast::IkSingleDOFSolutionBase<double>_>_>
                                ._M_impl.super__Vector_impl_data._M_start[uVar9].indices[1] +
                          *(int *)(*(long *)v + lVar7 * 4);
            iVar3._M_current = *(uint **)(v + 8);
            if (iVar3._M_current == *(uint **)(v + 0x10)) {
              std::vector<unsigned_int,_std::allocator<unsigned_int>_>::
              _M_realloc_insert<unsigned_int>(v,iVar3,local_58);
              pIVar10 = local_50;
            }
            else {
              *iVar3._M_current = local_58[0];
              *(uint **)(v + 8) = iVar3._M_current + 1;
            }
            lVar7 = lVar7 + 1;
          } while (lVar11 + (ulong)(lVar11 == 0) != lVar7);
        }
        pIVar4 = (pIVar10->_vbasesol).
                 super__Vector_base<ikfast::IkSingleDOFSolutionBase<double>,_std::allocator<ikfast::IkSingleDOFSolutionBase<double>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        if (local_48 != lVar5 && pIVar4[uVar9].indices[0] != 0xff) {
          lVar5 = *(long *)v;
          lVar7 = 0;
          do {
            piVar1 = (int *)(lVar5 + lVar7 * 4);
            *piVar1 = *piVar1 + (uint)pIVar4[uVar9].indices[0];
            lVar7 = lVar7 + 1;
          } while (lVar11 + (ulong)(lVar11 == 0) != lVar7);
        }
      }
      bVar6 = 1 < (long)local_40;
      local_40 = local_38;
    } while (bVar6);
  }
  return;
}

Assistant:

virtual void GetSolutionIndices(std::vector<unsigned int>& v) const {
        v.resize(0);
        v.push_back(0);
        for(int i = (int)_vbasesol.size()-1; i >= 0; --i) {
            if( _vbasesol[i].maxsolutions != (unsigned char)-1 && _vbasesol[i].maxsolutions > 1 ) {
                for(size_t j = 0; j < v.size(); ++j) {
                    v[j] *= _vbasesol[i].maxsolutions;
                }
                size_t orgsize=v.size();
                if( _vbasesol[i].indices[1] != (unsigned char)-1 ) {
                    for(size_t j = 0; j < orgsize; ++j) {
                        v.push_back(v[j]+_vbasesol[i].indices[1]);
                    }
                }
                if( _vbasesol[i].indices[0] != (unsigned char)-1 ) {
                    for(size_t j = 0; j < orgsize; ++j) {
                        v[j] += _vbasesol[i].indices[0];
                    }
                }
            }
        }
    }